

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

EdgeIdx __thiscall Escape::CGraph::getEdgeBinary(CGraph *this,VertexIdx v1,VertexIdx v2)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  
  if (v1 < this->nVertices) {
    lVar4 = this->offsets[v1];
    lVar2 = this->offsets[v1 + 1];
    if (lVar4 < lVar2) {
      lVar2 = lVar2 + -1;
      do {
        lVar3 = (lVar2 + lVar4) / 2;
        lVar1 = this->nbors[lVar3];
        if (lVar1 == v2) {
          return lVar3;
        }
        if (lVar1 == v2 || lVar1 < v2) {
          lVar4 = lVar3 + 1;
        }
        else {
          lVar2 = lVar3 + -1;
        }
      } while (lVar4 <= lVar2);
    }
  }
  return -1;
}

Assistant:

EdgeIdx CGraph::getEdgeBinary(VertexIdx v1, VertexIdx v2) const {
    if (v1 >= nVertices)
        return -1;
    EdgeIdx low = offsets[v1];
    EdgeIdx high = offsets[v1 + 1] - 1;
    EdgeIdx mid;

    while (low <= high) {
        mid = (low + high) / 2;
        if (nbors[mid] == v2)
            return mid;
        if (nbors[mid] > v2)
            high = mid - 1;
        else
            low = mid + 1;
    }
    return -1;
}